

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic-tests.cpp
# Opt level: O0

void DumpToFile(bool *result)

{
  int iVar1;
  uint uVar2;
  TestClass2 *pTVar3;
  int local_cc;
  int i;
  TestClass2 *testArray2 [10];
  TestClass1 *testArray1 [10];
  TestClass1 *arr1;
  uint64_t memLeakSize;
  size_t memLeakCount;
  bool *result_local;
  
  memLeakCount = (size_t)result;
  MemPlumber::start(true,"dumptofile_test.log",false);
  operator_new__(400);
  for (local_cc = 0; local_cc < 10; local_cc = local_cc + 1) {
    pTVar3 = (TestClass2 *)operator_new(4);
    *(undefined4 *)pTVar3 = 0;
    testArray2[(long)local_cc + 9] = pTVar3;
    pTVar3 = (TestClass2 *)operator_new(0x30);
    TestClass2::TestClass2(pTVar3);
    *(TestClass2 **)(&stack0xffffffffffffff38 + (long)local_cc * 8) = pTVar3;
  }
  MemPlumber::memLeakCheck(&memLeakSize,(uint64_t *)&arr1,true,"dumptofile_memleakcheck.log",false);
  MemPlumber::stopAndFreeAllMemory();
  iVar1 = countLinesInFile("dumptofile_test.log");
  if (iVar1 == 0x3e) {
    iVar1 = countLinesInFile("dumptofile_memleakcheck.log");
    if (iVar1 != 0x1f) {
      uVar2 = countLinesInFile("dumptofile_memleakcheck.log");
      printf("%s:%d: FAILED. assert equal failed: actual: %d != expected: %d\n","DumpToFile",0x8f,
             (ulong)uVar2,0x1f);
      *(undefined1 *)memLeakCount = 0;
    }
  }
  else {
    uVar2 = countLinesInFile("dumptofile_test.log");
    printf("%s:%d: FAILED. assert equal failed: actual: %d != expected: %d\n","DumpToFile",0x8e,
           (ulong)uVar2,0x3e);
    *(undefined1 *)memLeakCount = 0;
  }
  return;
}

Assistant:

TEST_CASE(DumpToFile) {

    START_TEST_DUMP_TO_FILE("dumptofile_test.log", false);

    TestClass1* arr1 = new TestClass1[100];

    TestClass1* testArray1[10];
    TestClass2* testArray2[10];

    for (int i = 0; i < 10; i++) {
        testArray1[i] = new TestClass1();
        testArray2[i] = new TestClass2();
    }

    MemPlumber::memLeakCheck(memLeakCount, memLeakSize, true, "dumptofile_memleakcheck.log", false);

    STOP_TEST;

    #if !defined _MSC_VER || !defined _DEBUG
    TEST_ASSERT_EQUAL(countLinesInFile("dumptofile_test.log"), 62);
    TEST_ASSERT_EQUAL(countLinesInFile("dumptofile_memleakcheck.log"), 31);
    #else
    TEST_ASSERT_EQUAL(countLinesInFile("dumptofile_test.log"), 82);
    TEST_ASSERT_EQUAL(countLinesInFile("dumptofile_memleakcheck.log"), 41);
    #endif
}